

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O2

Expression *
slang::ast::CallExpression::fromSystemMethod
          (Compilation *compilation,Expression *expr,MemberSelector *selector,
          InvocationExpressionSyntax *syntax,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  Type *pTVar1;
  Compilation *compilation_00;
  Diagnostic *pDVar2;
  Expression *pEVar3;
  Scope *in_stack_ffffffffffffffb0;
  SourceRange local_48;
  
  pTVar1 = Type::getCanonicalType((expr->type).ptr);
  compilation_00 =
       (Compilation *)
       Compilation::getSystemMethod(compilation,(pTVar1->super_Symbol).kind,selector->name);
  if (compilation_00 != (Compilation *)0x0) {
    if (syntax == (InvocationExpressionSyntax *)0x0) {
      local_48 = expr->sourceRange;
    }
    else {
      local_48 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    }
    pEVar3 = createSystemCall((CallExpression *)compilation,compilation_00,(SystemSubroutine *)expr,
                              (Expression *)syntax,(InvocationExpressionSyntax *)withClause,
                              (ArrayOrRandomizeMethodExpressionSyntax *)context,local_48,
                              (ASTContext *)0x0,in_stack_ffffffffffffffb0);
    return pEVar3;
  }
  if (syntax == (InvocationExpressionSyntax *)0x0) {
    pDVar2 = ASTContext::addDiag(context,(DiagCode)0x650007,selector->dotLocation);
    Diagnostic::operator<<(pDVar2,expr->sourceRange);
    Diagnostic::operator<<(pDVar2,selector->nameRange);
  }
  else {
    pDVar2 = ASTContext::addDiag(context,(DiagCode)0x3c000a,selector->nameRange);
    pDVar2 = Diagnostic::operator<<(pDVar2,selector->name);
  }
  ast::operator<<(pDVar2,(expr->type).ptr);
  pEVar3 = Expression::badExpr(compilation,expr);
  return pEVar3;
}

Assistant:

Expression& CallExpression::fromSystemMethod(
    Compilation& compilation, const Expression& expr, const LookupResult::MemberSelector& selector,
    const InvocationExpressionSyntax* syntax,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context) {

    const Type& type = expr.type->getCanonicalType();
    auto subroutine = compilation.getSystemMethod(type.kind, selector.name);
    if (!subroutine) {
        if (syntax) {
            context.addDiag(diag::UnknownSystemMethod, selector.nameRange)
                << selector.name << *expr.type;
        }
        else {
            auto& diag = context.addDiag(diag::InvalidMemberAccess, selector.dotLocation);
            diag << expr.sourceRange;
            diag << selector.nameRange;
            diag << *expr.type;
        }
        return badExpr(compilation, &expr);
    }

    return createSystemCall(compilation, *subroutine, &expr, syntax, withClause,
                            syntax ? syntax->sourceRange() : expr.sourceRange, context);
}